

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_ptr.h
# Opt level: O1

intrusive_ptr<booster::callable<void_()>_> * __thiscall
booster::intrusive_ptr<booster::callable<void_()>_>::operator=
          (intrusive_ptr<booster::callable<void_()>_> *this,callable<void_()> *rhs)

{
  callable<void_()> *pcVar1;
  intrusive_ptr<booster::callable<void_()>_> local_10;
  
  local_10.p_ = rhs;
  if (rhs != (callable<void_()> *)0x0) {
    booster::atomic_counter::inc();
  }
  pcVar1 = this->p_;
  this->p_ = (callable<void_()> *)local_10;
  local_10.p_ = pcVar1;
  ~intrusive_ptr(&local_10);
  return this;
}

Assistant:

intrusive_ptr & operator=(T * rhs)
    {
        this_type(rhs).swap(*this);
        return *this;
    }